

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

void __thiscall djb::tab::compute_cdf(tab *this)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float extraout_XMM0_Da;
  float fVar9;
  vec2 local_c8;
  float local_c0;
  float local_bc;
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  float local_a8;
  float local_a4;
  long local_a0;
  float local_98;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  vec2 local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  
  local_a0 = 0;
  lVar4 = 0;
  while (lVar4 != 0x20) {
    fVar6 = (float)(int)lVar4 * 0.03125;
    fVar6 = (fVar6 + fVar6 + -1.0) * 3.1415927;
    local_80 = lVar4;
    local_b8 = cosf(fVar6);
    local_bc = sinf(fVar6);
    lVar3 = 0;
    lVar4 = local_a0;
    while (lVar3 != 0x10) {
      local_98 = SQRT((float)(int)lVar3 / 15.0) * 3.1415927 * 0.5;
      local_78 = lVar3;
      fVar7 = cosf(local_98);
      fVar6 = 0.0;
      if (0.0 <= fVar7) {
        fVar6 = fVar7;
      }
      fVar7 = sinf(local_98);
      local_b0 = local_b8 * fVar7;
      iVar2 = 0x200;
      while (bVar5 = iVar2 != 0, iVar2 = iVar2 + -1, bVar5) {
        local_c8.x = 0.0;
        local_c8.y = 0.0;
        std::vector<djb::vec2,_std::allocator<djb::vec2>_>::emplace_back<djb::vec2>
                  (&this->m_cdf,&local_c8);
      }
      local_b4 = 1.0;
      if (fVar6 <= 1.0) {
        local_b4 = fVar6;
      }
      fVar7 = fVar7 * local_bc;
      lVar3 = 1;
      local_70 = lVar4;
      while (lVar3 != 0x40) {
        local_a8 = (float)(int)lVar3 * 0.015625;
        fVar6 = local_a8 * local_a8 * 3.1415927 * 0.5;
        local_68 = lVar3;
        local_ac = cosf(fVar6);
        local_58 = sinf(fVar6);
        fVar6 = 0.0;
        fStack_54 = local_58;
        fStack_50 = local_58;
        fStack_4c = local_58;
        local_48 = local_58;
        for (lVar3 = 0; lVar3 != 0x200; lVar3 = lVar3 + 1) {
          fVar8 = (float)(int)lVar3 * 0.001953125;
          local_a4 = (fVar8 + fVar8 + -1.0) * 3.1415927;
          local_98 = cosf(local_a4);
          fVar8 = sinf(local_a4);
          local_c8.y = fVar8 * fStack_54;
          local_c8.x = local_98 * local_58;
          local_c0 = local_ac;
          (*(this->super_microfacet).super_brdf._vptr_brdf[0xb])(this,&local_c8);
          fVar9 = local_c0 * local_b4 + local_c8.x * local_b0 + local_c8.y * fVar7;
          fVar8 = 0.0;
          if (0.0 <= fVar9) {
            fVar8 = fVar9;
          }
          fVar9 = 1.0;
          if (fVar8 <= 1.0) {
            fVar9 = fVar8;
          }
          fVar8 = fVar9 * extraout_XMM0_Da * local_a8 * local_48;
          fVar6 = fVar6 + fVar8;
          uVar1 = *(undefined8 *)
                   ((long)&(this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar3].x + lVar4);
          local_60.y = fVar8 * 0.0061359233 + (float)((ulong)uVar1 >> 0x20);
          local_60.x = fVar6 * 0.09817477 * 0.0061359233 + (float)uVar1;
          std::vector<djb::vec2,_std::allocator<djb::vec2>_>::emplace_back<djb::vec2>
                    (&this->m_cdf,&local_60);
        }
        lVar4 = lVar4 + 0x1000;
        lVar3 = local_68 + 1;
      }
      lVar4 = local_70 + 0x40000;
      lVar3 = local_78 + 1;
    }
    local_a0 = local_a0 + 0x400000;
    lVar4 = local_80 + 1;
  }
  fwrite("djb_verbose: CDF ready\n",0x17,1,_stdout);
  return;
}

Assistant:

void tab::compute_cdf()
{
	int npi = 32;
	int nti = 16;
	int nu2 = 64;
	int nu1 = 512;
	double du2 = (double)m_pi() / nu1;
	double du1 = 2 * (double)m_pi() / nu2;

	for (int i4 = 0; i4 < npi; ++i4) {
		float_t u = (float_t)i4 / npi;   // in [0,1)
		float_t pi = (2 * u - 1) * m_pi(); // in [-pi,pi)
		float_t cpi = cos(pi), spi = sin(pi);

		for (int i3 = 0; i3 < nti; ++i3) {
			float_t u = (float_t)i3 / (nti - 1); // in [0,1]
			float_t ti = sqrt(u) * m_pi() / 2;     // in [0,pi/2]
			float_t zi = sat(cos(ti)), z_i = sin(ti);
			vec3 wi = vec3(z_i * cpi, z_i * spi, zi);

			// bottom row (zeroes since z_m = 0)
			for (int i1 = 0; i1 < nu1; ++i1)
				m_cdf.push_back(vec2(0));

			// rest of the domain
			for (int i2 = 1; i2 < nu2; ++i2) {
				float_t u2 = (float_t)i2 / nu2;   // in (0,1)
				float_t tm = sqr(u2) * m_pi() / 2;  // in [0,pi/2)
				float_t ctm = cos(tm), stm = sin(tm);
				double nint = 0;

				for (int i1 = 0; i1 < nu1; ++i1) {
					float_t u1 = (float_t)i1 / nu1;    // in [0,1)
					float_t pm = (2 * u1 - 1) * m_pi();  // in [phi_i-pi/2,phi_i+pi/2)
					float_t cpm = cos(pm), spm = sin(pm);
					vec3 wm = vec3(stm * cpm, stm * spm, ctm);
					float_t ndf = ndf_std(wm);
					float_t dp = sat(dot(wm, wi));
					int idx = i1 + nu1 * (i2 - 1 + nu2 * (i3 + nti * i4));
					vec2 nint2 = m_cdf[idx];
					float_t tmp = dp * ndf * u2 * stm;

					nint+= (double)tmp;
					m_cdf.push_back(vec2(nint * du1, tmp) * du2 + nint2);
				}
			}
		}
	}

#ifndef NVERBOSE
	DJB_LOG("djb_verbose: CDF ready\n");
#endif
}